

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O0

int amqp_encode_properties(uint16_t class_id,void *decoded,amqp_bytes_t encoded)

{
  amqp_bytes_t input;
  amqp_bytes_t input_00;
  amqp_bytes_t input_01;
  amqp_bytes_t input_02;
  amqp_bytes_t input_03;
  amqp_bytes_t input_04;
  amqp_bytes_t input_05;
  amqp_bytes_t input_06;
  amqp_bytes_t input_07;
  amqp_bytes_t input_08;
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  amqp_bytes_t encoded_04;
  amqp_bytes_t encoded_05;
  amqp_bytes_t encoded_06;
  amqp_bytes_t encoded_07;
  amqp_bytes_t encoded_08;
  amqp_bytes_t encoded_09;
  amqp_bytes_t encoded_10;
  amqp_bytes_t encoded_11;
  amqp_bytes_t encoded_12;
  amqp_bytes_t encoded_13;
  amqp_bytes_t encoded_14;
  amqp_bytes_t encoded_15;
  amqp_bytes_t encoded_16;
  amqp_bytes_t encoded_17;
  amqp_bytes_t encoded_18;
  amqp_bytes_t encoded_19;
  amqp_bytes_t encoded_20;
  amqp_bytes_t encoded_21;
  amqp_bytes_t encoded_22;
  amqp_bytes_t encoded_23;
  amqp_bytes_t encoded_24;
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t *in_RSI;
  ushort in_DI;
  int res;
  amqp_basic_properties_t *p;
  uint16_t partial_flags;
  amqp_flags_t remainder;
  amqp_flags_t remaining_flags;
  amqp_flags_t flags;
  size_t offset;
  size_t *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  uint8_t in_stack_ffffffffffffffb7;
  size_t *in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc0;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  int local_4;
  
  pvVar7 = (void *)0x0;
  uVar6 = (uint)*in_RSI;
  uVar4 = uVar6;
  while( true ) {
    uVar2 = uVar4 >> 0x10;
    uVar1 = (ushort)uVar4 & 0xfffe;
    if (uVar2 != 0) {
      uVar1 = uVar1 | 1;
    }
    encoded_00.len._2_2_ = uVar1;
    encoded_00.len._0_2_ = in_stack_ffffffffffffffc0;
    encoded_00.len._4_4_ = uVar2;
    encoded_00.bytes._0_4_ = uVar4;
    encoded_00.bytes._4_4_ = uVar6;
    iVar3 = amqp_encode_16(encoded_00,in_stack_ffffffffffffffb8,
                           CONCAT11(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb6));
    if (iVar3 == 0) break;
    uVar4 = uVar2;
    if (uVar2 == 0) {
      uVar4 = (uint)in_DI;
      local_4 = (int)pvVar7;
      if ((((uVar4 != 10) && (uVar4 != 0x14)) && (uVar4 != 0x1e)) &&
         ((uVar4 != 0x28 && (uVar4 != 0x32)))) {
        if (uVar4 == 0x3c) {
          uVar5 = uVar2;
          if (((uVar6 & 0x8000) == 0) ||
             (((in_RSI[1] < 0x100 &&
               (encoded_01.len._2_2_ = uVar1, encoded_01.len._0_2_ = in_stack_ffffffffffffffc0,
               encoded_01._4_8_ = 0, encoded_01.bytes._4_4_ = uVar6,
               iVar3 = amqp_encode_8(encoded_01,in_RSI,in_stack_ffffffffffffffb7), iVar3 != 0)) &&
              (encoded_02.len._2_2_ = uVar1, encoded_02.len._0_2_ = in_stack_ffffffffffffffc0,
              encoded_02.len._4_4_ = uVar2, encoded_02.bytes._0_4_ = uVar5,
              encoded_02.bytes._4_4_ = uVar6, input.len._4_2_ = in_stack_ffffffffffffffb4,
              input.len._0_4_ = uVar4, input.len._6_1_ = in_stack_ffffffffffffffb6,
              input.len._7_1_ = in_stack_ffffffffffffffb7, input.bytes = in_RSI,
              iVar3 = amqp_encode_bytes(encoded_02,in_stack_ffffffffffffffa8,input), iVar3 != 0))))
          {
            if (((uVar6 & 0x4000) == 0) ||
               (((in_RSI[3] < 0x100 &&
                 (encoded_03.len._2_2_ = uVar1, encoded_03.len._0_2_ = in_stack_ffffffffffffffc0,
                 encoded_03.len._4_4_ = uVar2, encoded_03.bytes._0_4_ = uVar5,
                 encoded_03.bytes._4_4_ = uVar6,
                 iVar3 = amqp_encode_8(encoded_03,in_RSI,in_stack_ffffffffffffffb7), iVar3 != 0)) &&
                (encoded_04.len._2_2_ = uVar1, encoded_04.len._0_2_ = in_stack_ffffffffffffffc0,
                encoded_04.len._4_4_ = uVar2, encoded_04.bytes._0_4_ = uVar5,
                encoded_04.bytes._4_4_ = uVar6, input_00.len._4_2_ = in_stack_ffffffffffffffb4,
                input_00.len._0_4_ = uVar4, input_00.len._6_1_ = in_stack_ffffffffffffffb6,
                input_00.len._7_1_ = in_stack_ffffffffffffffb7, input_00.bytes = in_RSI,
                iVar3 = amqp_encode_bytes(encoded_04,in_stack_ffffffffffffffa8,input_00), iVar3 != 0
                )))) {
              if ((uVar6 & 0x2000) != 0) {
                encoded_24.len._4_4_ = uVar6;
                encoded_24.len._0_4_ = uVar5;
                encoded_24.bytes = pvVar7;
                iVar3 = amqp_encode_table(encoded_24,
                                          (amqp_table_t *)
                                          CONCAT44(uVar2,CONCAT22(uVar1,in_stack_ffffffffffffffc0)),
                                          in_RSI);
                in_stack_ffffffffffffffb4 = (undefined2)iVar3;
                in_stack_ffffffffffffffb6 = (undefined1)((uint)iVar3 >> 0x10);
                in_stack_ffffffffffffffb7 = (uint8_t)((uint)iVar3 >> 0x18);
                if (iVar3 < 0) {
                  return iVar3;
                }
              }
              local_4 = (int)pvVar7;
              if (((uVar6 & 0x1000) == 0) ||
                 (encoded_05.len._2_2_ = uVar1, encoded_05.len._0_2_ = in_stack_ffffffffffffffc0,
                 encoded_05.len._4_4_ = uVar2, encoded_05.bytes._0_4_ = uVar5,
                 encoded_05.bytes._4_4_ = uVar6,
                 iVar3 = amqp_encode_8(encoded_05,in_RSI,in_stack_ffffffffffffffb7), iVar3 != 0)) {
                if (((uVar6 & 0x800) == 0) ||
                   (encoded_06.len._2_2_ = uVar1, encoded_06.len._0_2_ = in_stack_ffffffffffffffc0,
                   encoded_06.len._4_4_ = uVar2, encoded_06.bytes._0_4_ = uVar5,
                   encoded_06.bytes._4_4_ = uVar6,
                   iVar3 = amqp_encode_8(encoded_06,in_RSI,in_stack_ffffffffffffffb7), iVar3 != 0))
                {
                  if (((uVar6 & 0x400) == 0) ||
                     (((in_RSI[8] < 0x100 &&
                       (encoded_07.len._2_2_ = uVar1,
                       encoded_07.len._0_2_ = in_stack_ffffffffffffffc0,
                       encoded_07.len._4_4_ = uVar2, encoded_07.bytes._0_4_ = uVar5,
                       encoded_07.bytes._4_4_ = uVar6,
                       iVar3 = amqp_encode_8(encoded_07,in_RSI,in_stack_ffffffffffffffb7),
                       iVar3 != 0)) &&
                      (encoded_08.len._2_2_ = uVar1,
                      encoded_08.len._0_2_ = in_stack_ffffffffffffffc0, encoded_08.len._4_4_ = uVar2
                      , encoded_08.bytes._0_4_ = uVar5, encoded_08.bytes._4_4_ = uVar6,
                      input_01.len._4_2_ = in_stack_ffffffffffffffb4, input_01.len._0_4_ = uVar4,
                      input_01.len._6_1_ = in_stack_ffffffffffffffb6,
                      input_01.len._7_1_ = in_stack_ffffffffffffffb7, input_01.bytes = in_RSI,
                      iVar3 = amqp_encode_bytes(encoded_08,in_stack_ffffffffffffffa8,input_01),
                      iVar3 != 0)))) {
                    if (((uVar6 & 0x200) == 0) ||
                       (((in_RSI[10] < 0x100 &&
                         (encoded_09.len._2_2_ = uVar1,
                         encoded_09.len._0_2_ = in_stack_ffffffffffffffc0,
                         encoded_09.len._4_4_ = uVar2, encoded_09.bytes._0_4_ = uVar5,
                         encoded_09.bytes._4_4_ = uVar6,
                         iVar3 = amqp_encode_8(encoded_09,in_RSI,in_stack_ffffffffffffffb7),
                         iVar3 != 0)) &&
                        (encoded_10.len._2_2_ = uVar1,
                        encoded_10.len._0_2_ = in_stack_ffffffffffffffc0,
                        encoded_10.len._4_4_ = uVar2, encoded_10.bytes._0_4_ = uVar5,
                        encoded_10.bytes._4_4_ = uVar6,
                        input_02.len._4_2_ = in_stack_ffffffffffffffb4, input_02.len._0_4_ = uVar4,
                        input_02.len._6_1_ = in_stack_ffffffffffffffb6,
                        input_02.len._7_1_ = in_stack_ffffffffffffffb7, input_02.bytes = in_RSI,
                        iVar3 = amqp_encode_bytes(encoded_10,in_stack_ffffffffffffffa8,input_02),
                        iVar3 != 0)))) {
                      if (((uVar6 & 0x100) == 0) ||
                         (((in_RSI[0xc] < 0x100 &&
                           (encoded_11.len._2_2_ = uVar1,
                           encoded_11.len._0_2_ = in_stack_ffffffffffffffc0,
                           encoded_11.len._4_4_ = uVar2, encoded_11.bytes._0_4_ = uVar5,
                           encoded_11.bytes._4_4_ = uVar6,
                           iVar3 = amqp_encode_8(encoded_11,in_RSI,in_stack_ffffffffffffffb7),
                           iVar3 != 0)) &&
                          (encoded_12.len._2_2_ = uVar1,
                          encoded_12.len._0_2_ = in_stack_ffffffffffffffc0,
                          encoded_12.len._4_4_ = uVar2, encoded_12.bytes._0_4_ = uVar5,
                          encoded_12.bytes._4_4_ = uVar6,
                          input_03.len._4_2_ = in_stack_ffffffffffffffb4, input_03.len._0_4_ = uVar4
                          , input_03.len._6_1_ = in_stack_ffffffffffffffb6,
                          input_03.len._7_1_ = in_stack_ffffffffffffffb7, input_03.bytes = in_RSI,
                          iVar3 = amqp_encode_bytes(encoded_12,in_stack_ffffffffffffffa8,input_03),
                          iVar3 != 0)))) {
                        if (((uVar6 & 0x80) == 0) ||
                           (((in_RSI[0xe] < 0x100 &&
                             (encoded_13.len._2_2_ = uVar1,
                             encoded_13.len._0_2_ = in_stack_ffffffffffffffc0,
                             encoded_13.len._4_4_ = uVar2, encoded_13.bytes._0_4_ = uVar5,
                             encoded_13.bytes._4_4_ = uVar6,
                             iVar3 = amqp_encode_8(encoded_13,in_RSI,in_stack_ffffffffffffffb7),
                             iVar3 != 0)) &&
                            (encoded_14.len._2_2_ = uVar1,
                            encoded_14.len._0_2_ = in_stack_ffffffffffffffc0,
                            encoded_14.len._4_4_ = uVar2, encoded_14.bytes._0_4_ = uVar5,
                            encoded_14.bytes._4_4_ = uVar6,
                            input_04.len._4_2_ = in_stack_ffffffffffffffb4,
                            input_04.len._0_4_ = uVar4,
                            input_04.len._6_1_ = in_stack_ffffffffffffffb6,
                            input_04.len._7_1_ = in_stack_ffffffffffffffb7, input_04.bytes = in_RSI,
                            iVar3 = amqp_encode_bytes(encoded_14,in_stack_ffffffffffffffa8,input_04)
                            , iVar3 != 0)))) {
                          if (((uVar6 & 0x40) == 0) ||
                             (encoded_15.len._2_2_ = uVar1,
                             encoded_15.len._0_2_ = in_stack_ffffffffffffffc0,
                             encoded_15.len._4_4_ = uVar2, encoded_15.bytes._0_4_ = uVar5,
                             encoded_15.bytes._4_4_ = uVar6,
                             iVar3 = amqp_encode_64(encoded_15,in_RSI,
                                                    CONCAT17(in_stack_ffffffffffffffb7,
                                                             CONCAT16(in_stack_ffffffffffffffb6,
                                                                      CONCAT24(
                                                  in_stack_ffffffffffffffb4,uVar4)))), iVar3 != 0))
                          {
                            if (((uVar6 & 0x20) == 0) ||
                               (((in_RSI[0x11] < 0x100 &&
                                 (encoded_16.len._2_2_ = uVar1,
                                 encoded_16.len._0_2_ = in_stack_ffffffffffffffc0,
                                 encoded_16.len._4_4_ = uVar2, encoded_16.bytes._0_4_ = uVar5,
                                 encoded_16.bytes._4_4_ = uVar6,
                                 iVar3 = amqp_encode_8(encoded_16,in_RSI,in_stack_ffffffffffffffb7),
                                 iVar3 != 0)) &&
                                (encoded_17.len._2_2_ = uVar1,
                                encoded_17.len._0_2_ = in_stack_ffffffffffffffc0,
                                encoded_17.len._4_4_ = uVar2, encoded_17.bytes._0_4_ = uVar5,
                                encoded_17.bytes._4_4_ = uVar6,
                                input_05.len._4_2_ = in_stack_ffffffffffffffb4,
                                input_05.len._0_4_ = uVar4,
                                input_05.len._6_1_ = in_stack_ffffffffffffffb6,
                                input_05.len._7_1_ = in_stack_ffffffffffffffb7,
                                input_05.bytes = in_RSI,
                                iVar3 = amqp_encode_bytes(encoded_17,in_stack_ffffffffffffffa8,
                                                          input_05), iVar3 != 0)))) {
                              if (((uVar6 & 0x10) == 0) ||
                                 (((in_RSI[0x13] < 0x100 &&
                                   (encoded_18.len._2_2_ = uVar1,
                                   encoded_18.len._0_2_ = in_stack_ffffffffffffffc0,
                                   encoded_18.len._4_4_ = uVar2, encoded_18.bytes._0_4_ = uVar5,
                                   encoded_18.bytes._4_4_ = uVar6,
                                   iVar3 = amqp_encode_8(encoded_18,in_RSI,in_stack_ffffffffffffffb7
                                                        ), iVar3 != 0)) &&
                                  (encoded_19.len._2_2_ = uVar1,
                                  encoded_19.len._0_2_ = in_stack_ffffffffffffffc0,
                                  encoded_19.len._4_4_ = uVar2, encoded_19.bytes._0_4_ = uVar5,
                                  encoded_19.bytes._4_4_ = uVar6,
                                  input_06.len._4_2_ = in_stack_ffffffffffffffb4,
                                  input_06.len._0_4_ = uVar4,
                                  input_06.len._6_1_ = in_stack_ffffffffffffffb6,
                                  input_06.len._7_1_ = in_stack_ffffffffffffffb7,
                                  input_06.bytes = in_RSI,
                                  iVar3 = amqp_encode_bytes(encoded_19,in_stack_ffffffffffffffa8,
                                                            input_06), iVar3 != 0)))) {
                                if (((uVar6 & 8) == 0) ||
                                   (((in_RSI[0x15] < 0x100 &&
                                     (encoded_20.len._2_2_ = uVar1,
                                     encoded_20.len._0_2_ = in_stack_ffffffffffffffc0,
                                     encoded_20.len._4_4_ = uVar2, encoded_20.bytes._0_4_ = uVar5,
                                     encoded_20.bytes._4_4_ = uVar6,
                                     iVar3 = amqp_encode_8(encoded_20,in_RSI,
                                                           in_stack_ffffffffffffffb7), iVar3 != 0))
                                    && (encoded_21.len._2_2_ = uVar1,
                                       encoded_21.len._0_2_ = in_stack_ffffffffffffffc0,
                                       encoded_21.len._4_4_ = uVar2, encoded_21.bytes._0_4_ = uVar5,
                                       encoded_21.bytes._4_4_ = uVar6,
                                       input_07.len._4_2_ = in_stack_ffffffffffffffb4,
                                       input_07.len._0_4_ = uVar4,
                                       input_07.len._6_1_ = in_stack_ffffffffffffffb6,
                                       input_07.len._7_1_ = in_stack_ffffffffffffffb7,
                                       input_07.bytes = in_RSI,
                                       iVar3 = amqp_encode_bytes(encoded_21,
                                                                 in_stack_ffffffffffffffa8,input_07)
                                       , iVar3 != 0)))) {
                                  if (((uVar6 & 4) != 0) &&
                                     (((0xff < in_RSI[0x17] ||
                                       (encoded_22.len._2_2_ = uVar1,
                                       encoded_22.len._0_2_ = in_stack_ffffffffffffffc0,
                                       encoded_22.len._4_4_ = uVar2, encoded_22.bytes._0_4_ = uVar5,
                                       encoded_22.bytes._4_4_ = uVar6,
                                       iVar3 = amqp_encode_8(encoded_22,in_RSI,
                                                             in_stack_ffffffffffffffb7), iVar3 == 0)
                                       ) || (encoded_23.len._2_2_ = uVar1,
                                            encoded_23.len._0_2_ = in_stack_ffffffffffffffc0,
                                            encoded_23.len._4_4_ = uVar2,
                                            encoded_23.bytes._0_4_ = uVar5,
                                            encoded_23.bytes._4_4_ = uVar6,
                                            input_08.len._4_2_ = in_stack_ffffffffffffffb4,
                                            input_08.len._0_4_ = uVar4,
                                            input_08.len._6_1_ = in_stack_ffffffffffffffb6,
                                            input_08.len._7_1_ = in_stack_ffffffffffffffb7,
                                            input_08.bytes = in_RSI,
                                            iVar3 = amqp_encode_bytes(encoded_23,
                                                                      in_stack_ffffffffffffffa8,
                                                                      input_08), iVar3 == 0)))) {
                                    local_4 = -2;
                                  }
                                }
                                else {
                                  local_4 = -2;
                                }
                              }
                              else {
                                local_4 = -2;
                              }
                            }
                            else {
                              local_4 = -2;
                            }
                          }
                          else {
                            local_4 = -2;
                          }
                        }
                        else {
                          local_4 = -2;
                        }
                      }
                      else {
                        local_4 = -2;
                      }
                    }
                    else {
                      local_4 = -2;
                    }
                  }
                  else {
                    local_4 = -2;
                  }
                }
                else {
                  local_4 = -2;
                }
              }
              else {
                local_4 = -2;
              }
            }
            else {
              local_4 = -2;
            }
          }
          else {
            local_4 = -2;
          }
        }
        else if ((uVar4 != 0x55) && (uVar4 != 0x5a)) {
          local_4 = -3;
        }
      }
      return local_4;
    }
  }
  return -2;
}

Assistant:

int amqp_encode_properties(uint16_t class_id, void *decoded,
                           amqp_bytes_t encoded) {
  size_t offset = 0;

  /* Cheat, and get the flags out generically, relying on the
     similarity of structure between classes */
  amqp_flags_t flags = *(amqp_flags_t *)decoded; /* cheating! */

  {
    /* We take a copy of flags to avoid destroying it, as it is used
       in the autogenerated code below. */
    amqp_flags_t remaining_flags = flags;
    do {
      amqp_flags_t remainder = remaining_flags >> 16;
      uint16_t partial_flags = remaining_flags & 0xFFFE;
      if (remainder != 0) {
        partial_flags |= 1;
      }
      if (!amqp_encode_16(encoded, &offset, partial_flags))
        return AMQP_STATUS_BAD_AMQP_DATA;
      remaining_flags = remainder;
    } while (remaining_flags != 0);
  }

  switch (class_id) {
    case 10: {
      return (int)offset;
    }
    case 20: {
      return (int)offset;
    }
    case 30: {
      return (int)offset;
    }
    case 40: {
      return (int)offset;
    }
    case 50: {
      return (int)offset;
    }
    case 60: {
      amqp_basic_properties_t *p = (amqp_basic_properties_t *)decoded;
      if (flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        if (UINT8_MAX < p->content_type.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->content_type.len) ||
            !amqp_encode_bytes(encoded, &offset, p->content_type))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
        if (UINT8_MAX < p->content_encoding.len ||
            !amqp_encode_8(encoded, &offset,
                           (uint8_t)p->content_encoding.len) ||
            !amqp_encode_bytes(encoded, &offset, p->content_encoding))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_HEADERS_FLAG) {
        {
          int res = amqp_encode_table(encoded, &(p->headers), &offset);
          if (res < 0) return res;
        }
      }
      if (flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
        if (!amqp_encode_8(encoded, &offset, p->delivery_mode))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_PRIORITY_FLAG) {
        if (!amqp_encode_8(encoded, &offset, p->priority))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
        if (UINT8_MAX < p->correlation_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->correlation_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->correlation_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_REPLY_TO_FLAG) {
        if (UINT8_MAX < p->reply_to.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->reply_to.len) ||
            !amqp_encode_bytes(encoded, &offset, p->reply_to))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_EXPIRATION_FLAG) {
        if (UINT8_MAX < p->expiration.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->expiration.len) ||
            !amqp_encode_bytes(encoded, &offset, p->expiration))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
        if (UINT8_MAX < p->message_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->message_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->message_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TIMESTAMP_FLAG) {
        if (!amqp_encode_64(encoded, &offset, p->timestamp))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TYPE_FLAG) {
        if (UINT8_MAX < p->type.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->type.len) ||
            !amqp_encode_bytes(encoded, &offset, p->type))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_USER_ID_FLAG) {
        if (UINT8_MAX < p->user_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->user_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->user_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_APP_ID_FLAG) {
        if (UINT8_MAX < p->app_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->app_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->app_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
        if (UINT8_MAX < p->cluster_id.len ||
            !amqp_encode_8(encoded, &offset, (uint8_t)p->cluster_id.len) ||
            !amqp_encode_bytes(encoded, &offset, p->cluster_id))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      return (int)offset;
    }
    case 90: {
      return (int)offset;
    }
    case 85: {
      return (int)offset;
    }
    default:
      return AMQP_STATUS_UNKNOWN_CLASS;
  }
}